

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O0

bool __thiscall crnlib::lzma_codec::pack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  uint uVar1;
  uint uVar2;
  uint local_60;
  int local_5c;
  uint trial;
  int status;
  size_t outPropsSize;
  size_t destLen;
  uint8 *pComp_data;
  header *pHDR;
  vector<unsigned_char> *pvStack_30;
  uint max_comp_size;
  vector<unsigned_char> *buf_local;
  uchar *puStack_20;
  uint n_local;
  void *p_local;
  lzma_codec *this_local;
  
  if (n < 0x40000001) {
    pvStack_30 = buf;
    buf_local._4_4_ = n;
    puStack_20 = (uchar *)p;
    p_local = this;
    uVar1 = math::maximum<unsigned_int>(0x80,n >> 8);
    pHDR._4_4_ = n + uVar1;
    vector<unsigned_char>::resize(pvStack_30,pHDR._4_4_ + 0x14,false);
    pComp_data = vector<unsigned_char>::operator[](pvStack_30,0);
    destLen = (size_t)vector<unsigned_char>::operator[](pvStack_30,0x14);
    utils::zero_object<crnlib::lzma_codec::header>((header *)pComp_data);
    packed_uint<4U>::operator=((packed_uint<4U> *)(pComp_data + 0xc),buf_local._4_4_);
    uVar2 = adler32(puStack_20,(ulong)buf_local._4_4_,1);
    packed_uint<4U>::operator=((packed_uint<4U> *)(pComp_data + 0x10),uVar2);
    if (buf_local._4_4_ != 0) {
      outPropsSize = 0;
      _trial = 0;
      local_5c = 6;
      for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
        outPropsSize = (size_t)pHDR._4_4_;
        _trial = 5;
        local_5c = (*this->m_pCompress)
                             ((uchar *)destLen,&outPropsSize,puStack_20,(size_t)buf_local._4_4_,
                              pComp_data + 3,(size_t *)&trial,-1,0,-1,-1,-1,-1,1);
        if (local_5c != 7) break;
        pHDR._4_4_ = (buf_local._4_4_ + 1 >> 1) + pHDR._4_4_;
        vector<unsigned_char>::resize(pvStack_30,pHDR._4_4_ + 0x14,false);
        pComp_data = vector<unsigned_char>::operator[](pvStack_30,0);
        destLen = (size_t)vector<unsigned_char>::operator[](pvStack_30,0x14);
      }
      if (local_5c != 0) {
        vector<unsigned_char>::clear(pvStack_30);
        return false;
      }
      packed_uint<4U>::operator=((packed_uint<4U> *)(pComp_data + 8),(uint)outPropsSize);
      vector<unsigned_char>::resize(pvStack_30,(int)outPropsSize + 0x14,false);
    }
    packed_uint<2U>::operator=((packed_uint<2U> *)pComp_data,0x304c);
    uVar2 = adler32(pComp_data + 3,0x11,1);
    pComp_data[2] = (uint8)uVar2;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool lzma_codec::pack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        if (n > 1024U * 1024U * 1024U)
        {
            return false;
        }

        uint max_comp_size = n + math::maximum<uint>(128, n >> 8);
        buf.resize(sizeof(header) + max_comp_size);

        header* pHDR = reinterpret_cast<header*>(&buf[0]);
        uint8* pComp_data = &buf[sizeof(header)];

        utils::zero_object(*pHDR);

        pHDR->m_uncomp_size = n;
        pHDR->m_adler32 = adler32(p, n);

        if (n)
        {
            size_t destLen = 0;
            size_t outPropsSize = 0;
            int status = SZ_ERROR_INPUT_EOF;

            for (uint trial = 0; trial < 3; trial++)
            {
                destLen = max_comp_size;
                outPropsSize = cLZMAPropsSize;

                status = (*m_pCompress)(pComp_data, &destLen, reinterpret_cast<const unsigned char*>(p), n,
                    pHDR->m_lzma_props, &outPropsSize,
                    -1, /* 0 <= level <= 9, default = 5 */
                    0, /* default = (1 << 24) */
                    -1, /* 0 <= lc <= 8, default = 3  */
                    -1, /* 0 <= lp <= 4, default = 0  */
                    -1, /* 0 <= pb <= 4, default = 2  */
                    -1, /* 5 <= fb <= 273, default = 32 */
#ifdef WIN32
                    (g_number_of_processors > 1) ? 2 : 1
#else
                    1
#endif
                );

                if (status != SZ_ERROR_OUTPUT_EOF)
                {
                    break;
                }

                max_comp_size += ((n + 1) / 2);
                buf.resize(sizeof(header) + max_comp_size);
                pHDR = reinterpret_cast<header*>(&buf[0]);
                pComp_data = &buf[sizeof(header)];
            }

            if (status != SZ_OK)
            {
                buf.clear();
                return false;
            }

            pHDR->m_comp_size = static_cast<uint>(destLen);

            buf.resize(CRNLIB_SIZEOF_U32(header) + static_cast<uint32>(destLen));
        }

        pHDR->m_sig = header::cSig;
        pHDR->m_checksum = static_cast<uint8>(adler32((uint8*)pHDR + header::cChecksumSkipBytes, sizeof(header) - header::cChecksumSkipBytes));

        return true;
    }